

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O1

double __thiscall
mp::
PLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
::eval_2nd(PLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
           *this,double x)

{
  double dVar1;
  double dVar2;
  
  dVar1 = (((this->
            super_BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
            ).con_)->
          super_CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::PowConstExpId>
          ).params_._M_elems[0];
  dVar2 = pow(x,dVar1 + -2.0);
  return dVar2 * (dVar1 + -1.0) * dVar1;
}

Assistant:

double eval_2nd(double x) const override {
    return GetConParams()[0] *
        (GetConParams()[0]-1.0) *
        std::pow(x, GetConParams()[0]-2.0);
  }